

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

GLenum deqp::gls::ContextArray::primitiveToGL(Primitive primitive)

{
  uint *puVar1;
  Primitive primitive_local;
  
  puVar1 = de::getSizedArrayElement<4,4,unsigned_int>
                     ((uint (*) [4])primitiveToGL::primitives,primitive);
  return *puVar1;
}

Assistant:

GLenum ContextArray::primitiveToGL (Array::Primitive primitive)
{
	static const GLenum primitives[] =
	{
		GL_POINTS,			// PRIMITIVE_POINTS = 0,
		GL_TRIANGLES,		// PRIMITIVE_TRIANGLES,
		GL_TRIANGLE_FAN,	// PRIMITIVE_TRIANGLE_FAN,
		GL_TRIANGLE_STRIP	// PRIMITIVE_TRIANGLE_STRIP,
	};

	return de::getSizedArrayElement<Array::PRIMITIVE_LAST>(primitives, (int)primitive);
}